

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

int mime_subparts_seek(void *instream,curl_off_t offset,int whence)

{
  int iVar1;
  int iVar2;
  curl_mimepart *part;
  
  if (offset == 0 && whence == 0) {
    if (*(int *)((long)instream + 0x50) != 0) {
      part = (curl_mimepart *)instream;
      iVar2 = 0;
      while (part = part->nextpart, part != (curl_mimepart *)0x0) {
        iVar1 = mime_part_rewind(part);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
      }
      if (iVar2 != 0) {
        return iVar2;
      }
      *(undefined4 *)((long)instream + 0x50) = 0;
      *(undefined8 *)((long)instream + 0x58) = 0;
      *(undefined8 *)((long)instream + 0x60) = 0;
    }
    iVar2 = 0;
  }
  else {
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int mime_subparts_seek(void *instream, curl_off_t offset, int whence)
{
  curl_mime *mime = (curl_mime *) instream;
  curl_mimepart *part;
  int result = CURL_SEEKFUNC_OK;

  if(whence != SEEK_SET || offset)
    return CURL_SEEKFUNC_CANTSEEK;    /* Only support full rewind. */

  if(mime->state.state == MIMESTATE_BEGIN)
   return CURL_SEEKFUNC_OK;           /* Already rewound. */

  for(part = mime->firstpart; part; part = part->nextpart) {
    int res = mime_part_rewind(part);
    if(res != CURL_SEEKFUNC_OK)
      result = res;
  }

  if(result == CURL_SEEKFUNC_OK)
    mimesetstate(&mime->state, MIMESTATE_BEGIN, NULL);

  return result;
}